

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testAttributes.cpp
# Opt level: O0

void testAttributes(string *tempDir)

{
  ostream *poVar1;
  exception *e;
  string filename;
  Array2D<float> pf;
  int H;
  int W;
  int in_stack_00000310;
  int in_stack_00000314;
  char *in_stack_00000318;
  Array2D<float> *in_stack_00000320;
  int in_stack_00000b10;
  int in_stack_00000b14;
  char *in_stack_00000b18;
  Array2D<float> *in_stack_00000b20;
  Array2D<float> *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Array2D<float> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_58 [60];
  undefined4 local_1c;
  undefined4 local_18;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing built-in attributes");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_18 = 0xd9;
  local_1c = 0xc5;
  Imf_3_4::Array2D<float>::Array2D
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
             ,(long)in_stack_ffffffffffffff70);
  anon_unknown.dwarf_1bd66::fillPixels
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_1bd66::writeReadAttr
            (in_stack_00000b20,in_stack_00000b18,in_stack_00000b14,in_stack_00000b10);
  anon_unknown.dwarf_1bd66::channelList();
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_1bd66::longNames
            (in_stack_00000320,in_stack_00000318,in_stack_00000314,in_stack_00000310);
  Imf_3_4::TypedAttribute<int>::TypedAttribute((TypedAttribute<int> *)in_stack_ffffffffffffff70);
  print_type<int>((TypedAttribute<int> *)0x133851);
  Imf_3_4::TypedAttribute<int>::~TypedAttribute((TypedAttribute<int> *)&stack0xffffffffffffff98);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_58);
  Imf_3_4::Array2D<float>::~Array2D(in_stack_ffffffffffffff70);
  return;
}

Assistant:

void
testAttributes (const std::string& tempDir)
{
    try
    {
        cout << "Testing built-in attributes" << endl;

        const int W = 217;
        const int H = 197;

        Array2D<float> pf (H, W);
        fillPixels (pf, W, H);

        std::string filename = tempDir + "imf_test_attr.exr";

        writeReadAttr (pf, filename.c_str (), W, H);
        channelList ();
        longNames (pf, filename.c_str (), W, H);

        print_type (OPENEXR_IMF_NAMESPACE::TypedAttribute<int> ());

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}